

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O1

void io::throw_on_overflow::on_overflow<int>(int *param_1)

{
  undefined8 *__s;
  
  __s = (undefined8 *)__cxa_allocate_exception(0x290);
  memset(__s,0,0x290);
  *__s = &PTR__exception_001206e0;
  memset(__s + 0x21,0,0x100);
  *(undefined4 *)(__s + 0x41) = 0xffffffff;
  *(undefined8 *)((long)__s + 0x20c) = 0;
  *(undefined8 *)((long)__s + 0x214) = 0;
  *(undefined8 *)((long)__s + 0x21c) = 0;
  *(undefined8 *)((long)__s + 0x224) = 0;
  *(undefined8 *)((long)__s + 0x22c) = 0;
  *(undefined8 *)((long)__s + 0x234) = 0;
  *(undefined8 *)((long)__s + 0x23c) = 0;
  *(undefined8 *)((long)__s + 0x244) = 0;
  *(undefined8 *)((long)__s + 0x24c) = 0;
  *(undefined8 *)((long)__s + 0x254) = 0;
  *(undefined8 *)((long)__s + 0x25c) = 0;
  *(undefined8 *)((long)__s + 0x264) = 0;
  *(undefined8 *)((long)__s + 0x26c) = 0;
  *(undefined8 *)((long)__s + 0x274) = 0;
  *(undefined8 *)((long)__s + 0x27c) = 0;
  *(undefined8 *)((long)__s + 0x284) = 0;
  *__s = &PTR__exception_00120cb0;
  __cxa_throw(__s,&error::integer_overflow::typeinfo,std::exception::~exception);
}

Assistant:

static void on_overflow(T&){
                        throw error::integer_overflow();
                }